

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O2

CK_RV __thiscall SessionManager::closeAllSessions(SessionManager *this,Slot *slot)

{
  Token *this_00;
  CK_SLOT_ID CVar1;
  Slot *this_01;
  CK_SLOT_ID CVar2;
  CK_RV CVar3;
  pointer ppSVar4;
  MutexLocker lock;
  
  if (slot == (Slot *)0x0) {
    CVar3 = 3;
  }
  else {
    MutexLocker::MutexLocker(&lock,this->sessionsMutex);
    this_00 = Slot::getToken(slot);
    if (this_00 == (Token *)0x0) {
      CVar3 = 0xe0;
    }
    else {
      CVar1 = Slot::getSlotID(slot);
      for (ppSVar4 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppSVar4 !=
          (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
        if (*ppSVar4 != (Session *)0x0) {
          this_01 = Session::getSlot(*ppSVar4);
          CVar2 = Slot::getSlotID(this_01);
          if (CVar2 == CVar1) {
            if (*ppSVar4 != (Session *)0x0) {
              (*(*ppSVar4)->_vptr_Session[1])();
            }
            *ppSVar4 = (Session *)0x0;
          }
        }
      }
      Token::logout(this_00);
      CVar3 = 0;
    }
    MutexLocker::~MutexLocker(&lock);
  }
  return CVar3;
}

Assistant:

CK_RV SessionManager::closeAllSessions(Slot* slot)
{
	if (slot == NULL) return CKR_SLOT_ID_INVALID;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Get the token
	Token* token = slot->getToken();
	if (token == NULL) return CKR_TOKEN_NOT_PRESENT;

	// Close all sessions on this slot
	const CK_SLOT_ID slotID( slot->getSlotID() );
	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() == slotID)
		{
			delete *i;
			*i = NULL;
		}
	}

	// Logout from the token
	token->logout();

	return CKR_OK;
}